

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<unsigned_int&,spv::StorageClass,int>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1,int *p_2)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint uVar1;
  StorageClass SVar2;
  uint32_t uVar3;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var4;
  ulong count;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var5;
  size_t sVar6;
  SPIRVariable *pSVar7;
  
  this_00 = &this->vacants;
  sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
  if (sVar6 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(count * 0xb0);
    if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl ==
        (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
      _Var5._M_head_impl =
           (SPIRVariable *)
           _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,sVar6 + 1);
        sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar6] =
             _Var5._M_head_impl;
        sVar6 = sVar6 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar6;
        _Var5._M_head_impl = _Var5._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size + 1);
    sVar6 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .ptr[sVar6]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
         _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .buffer_size = sVar6 + 1;
    sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar7 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar6 - 1];
    if (sVar6 == 0) goto LAB_0028cfd8;
  }
  else {
    pSVar7 = (this_00->super_VectorView<spirv_cross::SPIRVariable_*>).ptr[sVar6 - 1];
  }
  SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar6 - 1);
LAB_0028cfd8:
  uVar1 = *p;
  SVar2 = *p_1;
  uVar3 = *p_2;
  (pSVar7->super_IVariant).self.id = 0;
  (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_0048ffb8;
  *(uint *)&(pSVar7->super_IVariant).field_0xc = uVar1;
  pSVar7->storage = SVar2;
  pSVar7->decoration = 0;
  (pSVar7->initializer).id = uVar3;
  (pSVar7->basevariable).id = 0;
  (pSVar7->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar7->dereference_chain).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar7->dereference_chain).stack_storage;
  (pSVar7->dereference_chain).buffer_capacity = 8;
  pSVar7->compat_builtin = false;
  pSVar7->statically_assigned = false;
  (pSVar7->static_expression).id = 0;
  (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0
  ;
  (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar7->dependees).stack_storage;
  (pSVar7->dependees).buffer_capacity = 8;
  pSVar7->parameter = (Parameter *)0x0;
  pSVar7->deferred_declaration = false;
  pSVar7->phi_variable = false;
  pSVar7->allocate_temporary_copy = false;
  pSVar7->remapped_variable = false;
  pSVar7->remapped_components = 0;
  *(undefined8 *)((long)&pSVar7->remapped_components + 3) = 0;
  return pSVar7;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}